

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O0

bool __thiscall
S2BooleanOperation::Impl::CrossingProcessor::ProcessEdge0
          (CrossingProcessor *this,ShapeEdgeId a_id,Edge *a,CrossingIterator *it)

{
  bool bVar1;
  PointCrossingResult PVar2;
  ostream *poVar3;
  bool local_71;
  bool contained;
  PointCrossingResult r;
  S2LogMessage local_48;
  S2LogMessageVoidify local_31;
  CrossingIterator *local_30;
  CrossingIterator *it_local;
  Edge *a_local;
  CrossingProcessor *this_local;
  ShapeEdgeId a_id_local;
  
  local_30 = it;
  it_local = (CrossingIterator *)a;
  a_local = (Edge *)this;
  unique0x10000174 = a_id;
  bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                    ((BasicVector<Vector3,_double,_3UL> *)a,&a->v1);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    if ((this->invert_a_ & 1U) == (this->invert_result_ & 1U)) {
      PVar2 = ProcessPointCrossings(this,stack0xffffffffffffffec,(S2Point *)it_local,local_30);
      local_71 = (this->inside_ & 1U) != (this->invert_b_ & 1U);
      if ((((uint3)PVar2 & 0x10000) != 0) && (this->polygon_model_ != SEMI_OPEN)) {
        local_71 = this->polygon_model_ == CLOSED;
      }
      if (((uint3)PVar2 & 0x100) != 0) {
        local_71 = true;
      }
      if ((((uint3)PVar2 & 1) != 0) && ((this->is_union_ & 1U) == 0)) {
        local_71 = true;
      }
      if (local_71 == (bool)(this->invert_b_ & 1U)) {
        a_id_local.shape_id._3_1_ = true;
      }
      else {
        a_id_local.shape_id._3_1_ = AddPointEdge(this,(S2Point *)it_local,0);
      }
    }
    else {
      SkipCrossings(this,stack0xffffffffffffffec,local_30);
      a_id_local.shape_id._3_1_ = true;
    }
    return a_id_local.shape_id._3_1_;
  }
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
             ,0x52d,kFatal,(ostream *)&std::cerr);
  poVar3 = S2LogMessage::stream(&local_48);
  poVar3 = std::operator<<(poVar3,"Check failed: (a.v0) == (a.v1) ");
  S2LogMessageVoidify::operator&(&local_31,poVar3);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_48);
}

Assistant:

bool S2BooleanOperation::Impl::CrossingProcessor::ProcessEdge0(
    ShapeEdgeId a_id, const S2Shape::Edge& a, CrossingIterator* it) {
  S2_DCHECK_EQ(a.v0, a.v1);
  // When a region is inverted, all points and polylines are discarded.
  if (invert_a_ != invert_result_) {
    SkipCrossings(a_id, it);
    return true;
  }
  PointCrossingResult r = ProcessPointCrossings(a_id, a.v0, it);

  // "contained" indicates whether the current point is inside the polygonal
  // interior of the opposite region, using semi-open boundaries.
  bool contained = inside_ ^ invert_b_;
  if (r.matches_polygon && polygon_model_ != PolygonModel::SEMI_OPEN) {
    contained = (polygon_model_ == PolygonModel::CLOSED);
  }
  if (r.matches_polyline) contained = true;

  // The output of UNION includes duplicate values, so ensure that points are
  // not suppressed by other points.
  if (r.matches_point && !is_union_) contained = true;

  // Test whether the point is contained after region B is inverted.
  if (contained == invert_b_) return true;  // Don't exit early.
  return AddPointEdge(a.v0, 0);
}